

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O0

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  bool local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  size_type loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *value_local;
  string *name_local;
  string *current_local;
  
  local_28 = value;
  value_local = name;
  name_local = current;
  sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)current);
  loc._7_1_ = 0;
  local_b9 = false;
  if (2 < sVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_48,name_local,0,2);
    loc._7_1_ = 1;
    bVar1 = ::std::operator==(&local_48,"--");
    local_b9 = false;
    if (bVar1) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](name_local,2);
      local_b9 = valid_first_char<char>(*pvVar3);
    }
  }
  if ((loc._7_1_ & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  if (local_b9 == false) {
    current_local._7_1_ = false;
  }
  else {
    local_58 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(name_local,'=',0);
    if (local_58 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b8,name_local,2,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (value_local,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (local_28,"");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,name_local,2,local_58 - 2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (value_local,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_98,name_local,local_58 + 1,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (local_28,&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    current_local._7_1_ = true;
  }
  return current_local._7_1_;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}